

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O2

string * __thiscall
FuzzingParameterSet::get_dist_string_abi_cxx11_
          (string *__return_storage_ptr__,FuzzingParameterSet *this)

{
  string *psVar1;
  ostream *poVar2;
  undefined1 auVar3 [8];
  pointer pdVar4;
  double *d;
  size_t i;
  ulong uVar5;
  stringstream local_1e0 [8];
  stringstream ss;
  undefined1 local_1d0 [376];
  string *local_58;
  undefined1 local_50 [8];
  vector<double,_std::allocator<double>_> probs;
  
  std::__cxx11::stringstream::stringstream(local_1e0);
  std::discrete_distribution<int>::probabilities
            ((vector<double,_std::allocator<double>_> *)local_50,&this->N_sided_probabilities);
  probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (auVar3 = local_50;
      auVar3 != (undefined1  [8])
                probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; auVar3 = (undefined1  [8])((long)auVar3 + 8)) {
    probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((double)probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + *(double *)auVar3);
  }
  auVar3 = local_50;
  pdVar4 = probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_start;
  local_58 = __return_storage_ptr__;
  for (uVar5 = 0; psVar1 = local_58, uVar5 < (ulong)((long)pdVar4 - (long)auVar3 >> 3);
      uVar5 = uVar5 + 1) {
    if ((*(double *)((long)auVar3 + uVar5 * 8) != 0.0) ||
       (NAN(*(double *)((long)auVar3 + uVar5 * 8)))) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1d0);
      std::operator<<(poVar2,"-sided: ");
      poVar2 = std::ostream::_M_insert<double>(*(double *)((long)local_50 + uVar5 * 8));
      std::operator<<(poVar2,"/");
      poVar2 = std::ostream::_M_insert<double>
                         ((double)probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar2,anon_var_dwarf_131723 + 3);
      auVar3 = local_50;
      pdVar4 = probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  std::__cxx11::stringbuf::str();
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)local_50);
  std::__cxx11::stringstream::~stringstream(local_1e0);
  return psVar1;
}

Assistant:

std::string FuzzingParameterSet::get_dist_string() const {
  std::stringstream ss;
  double total = 0;
  std::vector<double> probs = N_sided_probabilities.probabilities();
  for (const auto &d : probs) total += d;
  for (size_t i = 0; i < probs.size(); ++i) {
    if (probs[i]==0) continue;
    ss << i << "-sided: " << probs[i] << "/" << total << ", ";
  }
  return ss.str();
}